

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

int os_remove(lua_State *L)

{
  int iVar1;
  char *__filename;
  char *in_RDI;
  undefined4 unaff_retaddr;
  int unaff_retaddr_00;
  char *filename;
  size_t *in_stack_fffffffffffffff0;
  
  __filename = luaL_checklstring((lua_State *)CONCAT44(unaff_retaddr_00,unaff_retaddr),
                                 (int)((ulong)in_RDI >> 0x20),in_stack_fffffffffffffff0);
  remove(__filename);
  iVar1 = os_pushresult((lua_State *)filename,unaff_retaddr_00,in_RDI);
  return iVar1;
}

Assistant:

static int os_remove(lua_State*L){
const char*filename=luaL_checkstring(L,1);
return os_pushresult(L,remove(filename)==0,filename);
}